

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_privatekey_parsing.c
# Opt level: O3

int ec_privkey_import_der(secp256k1_context *ctx,uchar *out32,uchar *privkey,size_t privkeylen)

{
  byte *__src;
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  
  out32[0x10] = '\0';
  out32[0x11] = '\0';
  out32[0x12] = '\0';
  out32[0x13] = '\0';
  out32[0x14] = '\0';
  out32[0x15] = '\0';
  out32[0x16] = '\0';
  out32[0x17] = '\0';
  out32[0x18] = '\0';
  out32[0x19] = '\0';
  out32[0x1a] = '\0';
  out32[0x1b] = '\0';
  out32[0x1c] = '\0';
  out32[0x1d] = '\0';
  out32[0x1e] = '\0';
  out32[0x1f] = '\0';
  out32[0] = '\0';
  out32[1] = '\0';
  out32[2] = '\0';
  out32[3] = '\0';
  out32[4] = '\0';
  out32[5] = '\0';
  out32[6] = '\0';
  out32[7] = '\0';
  out32[8] = '\0';
  out32[9] = '\0';
  out32[10] = '\0';
  out32[0xb] = '\0';
  out32[0xc] = '\0';
  out32[0xd] = '\0';
  out32[0xe] = '\0';
  out32[0xf] = '\0';
  iVar3 = 0;
  iVar2 = 0;
  if ((((0 < (long)privkeylen) && (*privkey == '0')) && (privkeylen != 1)) &&
     (iVar2 = iVar3, (char)privkey[1] < '\0')) {
    uVar6 = privkey[1] & 0x7f;
    bVar1 = (byte)uVar6;
    if (0xfd < (byte)(bVar1 - 3)) {
      pbVar4 = privkey + privkeylen;
      pbVar7 = privkey + 2 + uVar6;
      if (pbVar7 <= pbVar4) {
        iVar2 = 0;
        if (bVar1 < 2) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)privkey[2] << 8;
        }
        if (((((pbVar7 + (uVar5 | pbVar7[-1]) <= pbVar4) && (pbVar7 + 3 <= pbVar4)) &&
             ((*pbVar7 == 2 && ((pbVar7[1] == 1 && (pbVar7[2] == 1)))))) &&
            (__src = pbVar7 + 5, __src <= pbVar4)) &&
           (((pbVar7[3] == 4 && (uVar5 = (ulong)pbVar7[4], uVar5 < 0x21)) &&
            (__src + uVar5 <= pbVar4)))) {
          if (uVar5 != 0) {
            memcpy(out32 + (0x20 - uVar5),__src,uVar5);
          }
          iVar3 = secp256k1_ec_seckey_verify(ctx,out32);
          iVar2 = 1;
          if (iVar3 == 0) {
            out32[0x10] = '\0';
            out32[0x11] = '\0';
            out32[0x12] = '\0';
            out32[0x13] = '\0';
            out32[0x14] = '\0';
            out32[0x15] = '\0';
            out32[0x16] = '\0';
            out32[0x17] = '\0';
            out32[0x18] = '\0';
            out32[0x19] = '\0';
            out32[0x1a] = '\0';
            out32[0x1b] = '\0';
            out32[0x1c] = '\0';
            out32[0x1d] = '\0';
            out32[0x1e] = '\0';
            out32[0x1f] = '\0';
            out32[0] = '\0';
            out32[1] = '\0';
            out32[2] = '\0';
            out32[3] = '\0';
            out32[4] = '\0';
            out32[5] = '\0';
            out32[6] = '\0';
            out32[7] = '\0';
            out32[8] = '\0';
            out32[9] = '\0';
            out32[10] = '\0';
            out32[0xb] = '\0';
            out32[0xc] = '\0';
            out32[0xd] = '\0';
            out32[0xe] = '\0';
            out32[0xf] = '\0';
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ec_privkey_import_der(const secp256k1_context* ctx, unsigned char *out32, const unsigned char *privkey, size_t privkeylen) {
    const unsigned char *end = privkey + privkeylen;
    int lenb = 0;
    int len = 0;
    memset(out32, 0, 32);
    /* sequence header */
    if (end < privkey+1 || *privkey != 0x30) {
        return 0;
    }
    privkey++;
    /* sequence length constructor */
    if (end < privkey+1 || !(*privkey & 0x80)) {
        return 0;
    }
    lenb = *privkey & ~0x80; privkey++;
    if (lenb < 1 || lenb > 2) {
        return 0;
    }
    if (end < privkey+lenb) {
        return 0;
    }
    /* sequence length */
    len = privkey[lenb-1] | (lenb > 1 ? privkey[lenb-2] << 8 : 0);
    privkey += lenb;
    if (end < privkey+len) {
        return 0;
    }
    /* sequence element 0: version number (=1) */
    if (end < privkey+3 || privkey[0] != 0x02 || privkey[1] != 0x01 || privkey[2] != 0x01) {
        return 0;
    }
    privkey += 3;
    /* sequence element 1: octet string, up to 32 bytes */
    if (end < privkey+2 || privkey[0] != 0x04 || privkey[1] > 0x20 || end < privkey+2+privkey[1]) {
        return 0;
    }
    if (privkey[1]) memcpy(out32 + 32 - privkey[1], privkey + 2, privkey[1]);
    if (!secp256k1_ec_seckey_verify(ctx, out32)) {
        memset(out32, 0, 32);
        return 0;
    }
    return 1;
}